

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

diyfp __thiscall nlohmann::detail::dtoa_impl::diyfp::normalize(diyfp *this,diyfp x)

{
  ulong uVar1;
  diyfp dVar2;
  
  uVar1 = x.f;
  if (this != (diyfp *)0x0) {
    if (-1 < (long)this) {
      do {
        this = (diyfp *)((long)this * 2);
        uVar1 = (ulong)((int)uVar1 - 1);
      } while (-1 < (long)this);
    }
    dVar2._8_8_ = uVar1 & 0xffffffff;
    dVar2.f = (uint64_t)this;
    return dVar2;
  }
  __assert_fail("x.f != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mrnexeon[P]dragonbook_cpp_compiler/src/nlohmann/json.hpp"
                ,0x31f7,"static diyfp nlohmann::detail::dtoa_impl::diyfp::normalize(diyfp)");
}

Assistant:

static diyfp normalize(diyfp x) noexcept
    {
        assert(x.f != 0);

        while ((x.f >> 63u) == 0)
        {
            x.f <<= 1u;
            x.e--;
        }

        return x;
    }